

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::LoadBanlist(BanMan *this)

{
  banmap_t *banSet;
  CClientUIInterface *this_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  Level level;
  BanMan *category;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  long local_78;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  bilingual_str local_60;
  long local_20;
  banmap_t *pbVar4;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock0,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x1f,false);
  this_00 = this->m_client_interface;
  if (this_00 != (CClientUIInterface *)0x0) {
    _(&local_60,(ConstevalStringLiteral)0x6cb73b);
    CClientUIInterface::InitMessage(this_00,&local_60.translated);
    bilingual_str::~bilingual_str(&local_60);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  banSet = &this->m_banned;
  pbVar4 = banSet;
  bVar1 = CBanDB::Read(&this->m_ban_db,banSet);
  level = (Level)pbVar4;
  if (bVar1) {
    category = this;
    SweepBanned(this);
    bVar1 = ::LogAcceptCategory((LogFlags)category,level);
    if (bVar1) {
      local_60.original._M_dataplus._M_p =
           (pointer)(this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_78 = (lVar3 - lVar2) / 1000000;
      logging_function._M_str = "LoadBanlist";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,source_file,0x28,NET,Debug,(ConstevalFormatString<2U>)0x6cb75a,
                 (unsigned_long *)&local_60,&local_78);
    }
  }
  else {
    logging_function_00._M_str = "LoadBanlist";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
    ;
    source_file_00._M_len = 0x5a;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x2a,ALL,Info,(ConstevalFormatString<0U>)0x6cb789)
    ;
    std::
    map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::operator=(banSet,(initializer_list<std::pair<const_CSubNet,_CBanEntry>_>)ZEXT816(0));
    this->m_is_dirty = true;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::LoadBanlist()
{
    LOCK(m_banned_mutex);

    if (m_client_interface) m_client_interface->InitMessage(_("Loading banlist…").translated);

    const auto start{SteadyClock::now()};
    if (m_ban_db.Read(m_banned)) {
        SweepBanned(); // sweep out unused entries

        LogDebug(BCLog::NET, "Loaded %d banned node addresses/subnets  %dms\n", m_banned.size(),
                 Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } else {
        LogPrintf("Recreating the banlist database\n");
        m_banned = {};
        m_is_dirty = true;
    }
}